

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  byte bVar1;
  bool bVar2;
  exception_t<cfgfile::string_trait_t> *x;
  tag_b_t<cfgfile::string_trait_t> tag;
  ofstream out;
  a_t a;
  vector<generator::a_t,_std::allocator<generator::a_t>_> list;
  b_t b;
  string *in_stack_fffffffffffffc28;
  tag_b_t<cfgfile::string_trait_t> *in_stack_fffffffffffffc30;
  value_type *in_stack_fffffffffffffc38;
  undefined7 in_stack_fffffffffffffc40;
  undefined1 in_stack_fffffffffffffc47;
  file_format_t in_stack_fffffffffffffcb4;
  ostream_t *in_stack_fffffffffffffcb8;
  tag_t<cfgfile::string_trait_t> *in_stack_fffffffffffffcc0;
  b_t *in_stack_fffffffffffffce8;
  tag_b_t<cfgfile::string_trait_t> *in_stack_fffffffffffffcf0;
  undefined1 local_2a0 [519];
  allocator local_99;
  string local_98 [108];
  int local_2c;
  b_t local_28;
  int local_4;
  
  local_4 = 0;
  generator::b_t::b_t((b_t *)0x1038d4);
  local_2c = 100;
  generator::b_t::set_integer_field(&local_28,&local_2c);
  std::vector<generator::a_t,_std::allocator<generator::a_t>_>::vector
            ((vector<generator::a_t,_std::allocator<generator::a_t>_> *)0x103900);
  generator::a_t::a_t((a_t *)0x10390d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"string",&local_99);
  generator::a_t::set_string_field((a_t *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::vector<generator::a_t,_std::allocator<generator::a_t>_>::push_back
            ((vector<generator::a_t,_std::allocator<generator::a_t>_> *)
             CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40),in_stack_fffffffffffffc38
            );
  generator::b_t::set_a_vector
            ((b_t *)in_stack_fffffffffffffc30,
             (vector<generator::a_t,_std::allocator<generator::a_t>_> *)in_stack_fffffffffffffc28);
  std::ofstream::ofstream(local_2a0,"generator.cfg",0x10);
  generator::tag_b_t<cfgfile::string_trait_t>::tag_b_t
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  bVar1 = std::ios::good();
  bVar2 = (bVar1 & 1) != 0;
  if (bVar2) {
    cfgfile::write_cfgfile<cfgfile::string_trait_t>
              (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb4);
    std::ofstream::close();
  }
  else {
    in_stack_fffffffffffffc30 =
         (tag_b_t<cfgfile::string_trait_t> *)
         std::operator<<((ostream *)&std::cout,
                         "Fialed to save configuration. Can\'t open file to write.");
    std::ostream::operator<<
              ((ostream *)in_stack_fffffffffffffc30,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
  }
  generator::tag_b_t<cfgfile::string_trait_t>::~tag_b_t(in_stack_fffffffffffffc30);
  if (bVar2) {
    std::operator<<((ostream *)&std::cout,"Configuration saved to \"generator.cfg\".\n");
    local_4 = 0;
  }
  std::ofstream::~ofstream(local_2a0);
  generator::a_t::~a_t((a_t *)0x103c41);
  std::vector<generator::a_t,_std::allocator<generator::a_t>_>::~vector
            ((vector<generator::a_t,_std::allocator<generator::a_t>_> *)
             CONCAT17(bVar1,in_stack_fffffffffffffc40));
  generator::b_t::~b_t((b_t *)0x103c5b);
  return local_4;
}

Assistant:

int main()
{
	generator::b_t b;
	b.set_integer_field( 100 );

	std::vector< generator::a_t > list;
	generator::a_t a;
	a.set_string_field( "string" );
	list.push_back( a );

	b.set_a_vector( list );

	std::ofstream out( "generator.cfg" );

	try {
		generator::tag_b_t< cfgfile::string_trait_t > tag( b );

		if( out.good() )
		{
			cfgfile::write_cfgfile( tag, out );

			out.close();
		}
		else
		{
			std::cout << "Fialed to save configuration. Can't open file to write."
				<< std::endl;

			return 1;
		}
	}
	catch( const cfgfile::exception_t< cfgfile::string_trait_t > & x )
	{
		out.close();

		std::cout << x.desc() << std::endl;

		return 1;
	}

	std::cout << "Configuration saved to \"generator.cfg\".\n";

	return 0;
}